

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::ParseTextureNameAndOption
               (string *texname,texture_option_t *texopt,char *linebuf,bool is_bump)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  texture_type_t tVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  real_t rVar10;
  string texture_name;
  byte *local_88;
  allocator<char> local_7d;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  texopt->imfchan = is_bump ^ 0x6d;
  texopt->bump_multiplier = 1.0;
  local_7c = 0;
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  texopt->sharpness = 1.0;
  texopt->brightness = 0.0;
  texopt->contrast = 1.0;
  texopt->origin_offset[0] = 0.0;
  texopt->origin_offset[1] = 0.0;
  texopt->origin_offset[2] = 0.0;
  texopt->scale[0] = 1.0;
  texopt->scale[1] = 1.0;
  *(undefined8 *)(texopt->scale + 2) = 0x3f800000;
  texopt->turbulence[1] = 0.0;
  texopt->turbulence[2] = 0.0;
  texopt->type = TEXTURE_TYPE_NONE;
  local_58 = texname;
LAB_00120671:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
              if ((local_7c & 1) != 0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign(local_58,&local_78);
              }
              paVar5 = &local_78.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != paVar5) {
                operator_delete(local_78._M_dataplus._M_p,
                                CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                         local_78.field_2._M_local_buf[0]) + 1);
                paVar5 = extraout_RAX_00;
              }
              return SUB81(paVar5,0);
            }
            sVar3 = strspn(linebuf," \t");
            pbVar7 = (byte *)linebuf + sVar3;
            local_88 = pbVar7;
            iVar2 = strncmp((char *)pbVar7,"-blendu",7);
            if ((iVar2 != 0) || ((pbVar7[7] != 0x20 && (pbVar7[7] != 9)))) break;
            local_88 = pbVar7 + 8;
            sVar3 = strspn((char *)local_88," \t");
            pbVar8 = pbVar7 + sVar3 + 8;
            local_88 = pbVar8;
            sVar4 = strcspn((char *)pbVar8," \t\r");
            bVar9 = true;
            if ((*pbVar8 == 0x6f) && (pbVar7[sVar3 + 9] == 0x66)) {
              bVar9 = pbVar7[sVar3 + 10] != 0x66;
            }
            linebuf = (char *)(pbVar8 + sVar4);
            texopt->blendu = bVar9;
            local_88 = (byte *)linebuf;
          }
          iVar2 = strncmp((char *)pbVar7,"-blendv",7);
          if ((iVar2 != 0) || ((pbVar7[7] != 0x20 && (pbVar7[7] != 9)))) break;
          local_88 = pbVar7 + 8;
          sVar3 = strspn((char *)local_88," \t");
          pbVar8 = pbVar7 + sVar3 + 8;
          local_88 = pbVar8;
          sVar4 = strcspn((char *)pbVar8," \t\r");
          bVar9 = true;
          if ((*pbVar8 == 0x6f) && (pbVar7[sVar3 + 9] == 0x66)) {
            bVar9 = pbVar7[sVar3 + 10] != 0x66;
          }
          linebuf = (char *)(pbVar8 + sVar4);
          texopt->blendv = bVar9;
          local_88 = (byte *)linebuf;
        }
        iVar2 = strncmp((char *)pbVar7,"-clamp",6);
        if ((iVar2 != 0) || ((pbVar7[6] != 0x20 && (pbVar7[6] != 9)))) break;
        local_88 = pbVar7 + 7;
        sVar3 = strspn((char *)local_88," \t");
        pbVar8 = pbVar7 + sVar3 + 7;
        local_88 = pbVar8;
        sVar4 = strcspn((char *)pbVar8," \t\r");
        bVar9 = true;
        if ((*pbVar8 == 0x6f) && (pbVar7[sVar3 + 8] == 0x66)) {
          bVar9 = pbVar7[sVar3 + 9] != 0x66;
        }
        linebuf = (char *)(pbVar8 + sVar4);
        texopt->clamp = bVar9;
        local_88 = (byte *)linebuf;
      }
      iVar2 = strncmp((char *)pbVar7,"-boost",6);
      if ((iVar2 != 0) || ((pbVar7[6] != 0x20 && (pbVar7[6] != 9)))) break;
      local_88 = pbVar7 + 7;
      rVar10 = parseReal((char **)&local_88,1.0);
      texopt->sharpness = rVar10;
      linebuf = (char *)local_88;
    }
    bVar1 = *pbVar7;
    if (bVar1 == 0x2d) {
      if (((pbVar7[1] == 0x62) && (pbVar7[2] == 0x6d)) && ((pbVar7[3] == 0x20 || (pbVar7[3] == 9))))
      {
        local_88 = pbVar7 + 4;
        rVar10 = parseReal((char **)&local_88,1.0);
        texopt->bump_multiplier = rVar10;
        linebuf = (char *)local_88;
        goto LAB_00120671;
      }
      if ((pbVar7[1] == 0x6f) && ((pbVar7[2] == 0x20 || (pbVar7[2] == 9)))) {
        local_88 = pbVar7 + 3;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->origin_offset[0] = rVar10;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->origin_offset[1] = rVar10;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->origin_offset[2] = rVar10;
        linebuf = (char *)local_88;
        goto LAB_00120671;
      }
      if ((pbVar7[1] == 0x73) && ((pbVar7[2] == 0x20 || (pbVar7[2] == 9)))) {
        local_88 = pbVar7 + 3;
        rVar10 = parseReal((char **)&local_88,1.0);
        texopt->scale[0] = rVar10;
        rVar10 = parseReal((char **)&local_88,1.0);
        texopt->scale[1] = rVar10;
        rVar10 = parseReal((char **)&local_88,1.0);
        texopt->scale[2] = rVar10;
        linebuf = (char *)local_88;
        goto LAB_00120671;
      }
      if ((pbVar7[1] == 0x74) && ((pbVar7[2] == 0x20 || (pbVar7[2] == 9)))) {
        local_88 = pbVar7 + 3;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->turbulence[0] = rVar10;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->turbulence[1] = rVar10;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->turbulence[2] = rVar10;
        linebuf = (char *)local_88;
        goto LAB_00120671;
      }
    }
    iVar2 = strncmp((char *)pbVar7,"-type",5);
    if ((iVar2 == 0) && ((pbVar7[5] == 0x20 || (pbVar7[5] == 9)))) {
      pbVar7 = pbVar7 + 5;
      local_88 = pbVar7;
      sVar3 = strspn((char *)pbVar7," \t");
      pbVar7 = pbVar7 + sVar3;
      local_88 = pbVar7;
      sVar3 = strcspn((char *)pbVar7," \t\r");
      iVar2 = strncmp((char *)pbVar7,"cube_top",8);
      if (iVar2 == 0) {
        tVar6 = TEXTURE_TYPE_CUBE_TOP;
      }
      else {
        iVar2 = strncmp((char *)pbVar7,"cube_bottom",0xb);
        if (iVar2 == 0) {
          tVar6 = TEXTURE_TYPE_CUBE_BOTTOM;
        }
        else {
          iVar2 = strncmp((char *)pbVar7,"cube_left",9);
          if (iVar2 == 0) {
            tVar6 = TEXTURE_TYPE_CUBE_LEFT;
          }
          else {
            iVar2 = strncmp((char *)pbVar7,"cube_right",10);
            if (iVar2 == 0) {
              tVar6 = TEXTURE_TYPE_CUBE_RIGHT;
            }
            else {
              iVar2 = strncmp((char *)pbVar7,"cube_front",10);
              if (iVar2 == 0) {
                tVar6 = TEXTURE_TYPE_CUBE_FRONT;
              }
              else {
                iVar2 = strncmp((char *)pbVar7,"cube_back",9);
                if (iVar2 == 0) {
                  tVar6 = TEXTURE_TYPE_CUBE_BACK;
                }
                else {
                  iVar2 = strncmp((char *)pbVar7,"sphere",6);
                  tVar6 = (texture_type_t)(iVar2 == 0);
                }
              }
            }
          }
        }
      }
      linebuf = (char *)(pbVar7 + sVar3);
      texopt->type = tVar6;
      local_88 = (byte *)linebuf;
    }
    else {
      iVar2 = strncmp((char *)pbVar7,"-imfchan",8);
      if ((iVar2 == 0) && ((pbVar7[8] == 0x20 || (pbVar7[8] == 9)))) {
        local_88 = pbVar7 + 9;
        sVar3 = strspn((char *)local_88," \t");
        pbVar7 = pbVar7 + sVar3 + 9;
        local_88 = pbVar7;
        sVar3 = strcspn((char *)pbVar7," \t\r");
        if (sVar3 == 1) {
          texopt->imfchan = *pbVar7;
        }
        linebuf = (char *)(pbVar7 + sVar3);
        local_88 = (byte *)linebuf;
      }
      else if (((bVar1 == 0x2d) && ((pbVar7[1] == 0x6d && (pbVar7[2] == 0x6d)))) &&
              ((pbVar7[3] == 0x20 || (pbVar7[3] == 9)))) {
        local_88 = pbVar7 + 4;
        rVar10 = parseReal((char **)&local_88,0.0);
        texopt->brightness = rVar10;
        rVar10 = parseReal((char **)&local_88,1.0);
        texopt->contrast = rVar10;
        linebuf = (char *)local_88;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)pbVar7,&local_7d);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_78,&local_50);
        paVar5 = &local_50.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar5) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          paVar5 = extraout_RAX;
        }
        linebuf = (char *)(pbVar7 + local_78._M_string_length);
        local_7c = (uint)CONCAT71((int7)((ulong)paVar5 >> 8),1);
        local_88 = (byte *)linebuf;
      }
    }
  } while( true );
}

Assistant:

static bool ParseTextureNameAndOption(std::string *texname,
                                      texture_option_t *texopt,
                                      const char *linebuf, const bool is_bump) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  // Fill with default value for texopt.
  if (is_bump) {
    texopt->imfchan = 'l';
  } else {
    texopt->imfchan = 'm';
  }
  texopt->bump_multiplier = 1.0f;
  texopt->clamp = false;
  texopt->blendu = true;
  texopt->blendv = true;
  texopt->sharpness = 1.0f;
  texopt->brightness = 0.0f;
  texopt->contrast = 1.0f;
  texopt->origin_offset[0] = 0.0f;
  texopt->origin_offset[1] = 0.0f;
  texopt->origin_offset[2] = 0.0f;
  texopt->scale[0] = 1.0f;
  texopt->scale[1] = 1.0f;
  texopt->scale[2] = 1.0f;
  texopt->turbulence[0] = 0.0f;
  texopt->turbulence[1] = 0.0f;
  texopt->turbulence[2] = 0.0f;
  texopt->type = TEXTURE_TYPE_NONE;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else {
      // Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}